

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinSop.c
# Opt level: O0

void Min_SopRewrite(Min_Man_t *p)

{
  int iVar1;
  Min_Cube_t **ppMVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int nPairs;
  int nCubesOld;
  int fCont1;
  int fCont0;
  int Index;
  int Var1;
  int Var0;
  int v11;
  int v10;
  int v01;
  int v00;
  Min_Cube_t *pTemp;
  Min_Cube_t **ppPrevT;
  Min_Cube_t *pThis;
  Min_Cube_t **ppPrev;
  Min_Cube_t *pCube;
  Min_Man_t *p_local;
  
  p->pBubble->pNext = *p->ppStore;
  *p->ppStore = p->pBubble;
  *(uint *)&p->pBubble->field_0x8 = *(uint *)&p->pBubble->field_0x8 & 0x3fffff;
  pCube = (Min_Cube_t *)p;
  do {
    fCont1 = *(uint *)(*(long *)&pCube[4].field_0x8 + 8) >> 0x16;
    pThis = (Min_Cube_t *)(*(long *)&pCube[5].field_0x8 + (long)fCont1 * 8);
    for (ppPrev = *(Min_Cube_t ***)(*(long *)&pCube[5].field_0x8 + (long)fCont1 * 8);
        (ppPrev != (Min_Cube_t **)0x0 && (ppPrev != *(Min_Cube_t ***)&pCube[4].field_0x8));
        ppPrev = &(*ppPrev)->pNext) {
      pThis = (Min_Cube_t *)ppPrev;
    }
    if (ppPrev != *(Min_Cube_t ***)&pCube[4].field_0x8) {
      __assert_fail("pCube == p->pBubble",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                    ,0x6c,"void Min_SopRewrite(Min_Man_t *)");
    }
    pThis->pNext = (Min_Cube_t *)**(undefined8 **)&pCube[4].field_0x8;
    ppPrev = (Min_Cube_t **)**(long **)&pCube[4].field_0x8;
    if (ppPrev == (Min_Cube_t **)0x0) {
      do {
        fCont1 = fCont1 + 1;
        if (*(int *)&pCube->pNext < fCont1) goto LAB_005208c7;
      } while (*(long *)(*(long *)&pCube[5].field_0x8 + (long)fCont1 * 8) == 0);
      pThis = (Min_Cube_t *)(*(long *)&pCube[5].field_0x8 + (long)fCont1 * 8);
      ppPrev = *(Min_Cube_t ***)(*(long *)&pCube[5].field_0x8 + (long)fCont1 * 8);
    }
LAB_005208c7:
    if (ppPrev == (Min_Cube_t **)0x0) {
      return;
    }
    ppPrevT = &(*ppPrev)->pNext;
    pTemp = (Min_Cube_t *)ppPrev;
    while ((ppPrevT != (Min_Cube_t **)0x0 &&
           (iVar3 = Min_CubesDistTwo((Min_Cube_t *)ppPrev,(Min_Cube_t *)ppPrevT,&Index,&fCont0),
           iVar3 == 0))) {
      pTemp = (Min_Cube_t *)ppPrevT;
      ppPrevT = &(*ppPrevT)->pNext;
    }
    if ((ppPrevT == (Min_Cube_t **)0x0) && (fCont1 < *(int *)&pCube->pNext)) {
      ppPrevT = *(Min_Cube_t ***)(*(long *)&pCube[5].field_0x8 + (long)(fCont1 + 1) * 8);
      pTemp = (Min_Cube_t *)(*(long *)&pCube[5].field_0x8 + (long)(fCont1 + 1) * 8);
      while ((ppPrevT != (Min_Cube_t **)0x0 &&
             (iVar3 = Min_CubesDistTwo((Min_Cube_t *)ppPrev,(Min_Cube_t *)ppPrevT,&Index,&fCont0),
             iVar3 == 0))) {
        pTemp = (Min_Cube_t *)ppPrevT;
        ppPrevT = &(*ppPrevT)->pNext;
      }
    }
    if (ppPrevT == (Min_Cube_t **)0x0) {
      **(undefined8 **)&pCube[4].field_0x8 = *ppPrev;
      *ppPrev = *(Min_Cube_t **)&pCube[4].field_0x8;
      *(uint *)(*(long *)&pCube[4].field_0x8 + 8) =
           *(uint *)(*(long *)&pCube[4].field_0x8 + 8) & 0x3fffff |
           *(uint *)(ppPrev + 1) & 0xffc00000;
    }
    else {
      pTemp->pNext = *ppPrevT;
      pThis->pNext = *(Min_Cube_t **)&pCube[4].field_0x8;
      **(undefined8 **)&pCube[4].field_0x8 = *ppPrev;
      *(uint *)(*(long *)&pCube[4].field_0x8 + 8) =
           *(uint *)(*(long *)&pCube[4].field_0x8 + 8) & 0x3fffff |
           *(uint *)(ppPrev + 1) & 0xffc00000;
      *(int *)&pCube[5].pNext = *(int *)&pCube[5].pNext + -2;
      if ((ppPrev == *(Min_Cube_t ***)&pCube[4].field_0x8) ||
         (ppPrevT == *(Min_Cube_t ***)&pCube[4].field_0x8)) {
        __assert_fail("pCube != p->pBubble && pThis != p->pBubble",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                      ,0x9b,"void Min_SopRewrite(Min_Man_t *)");
      }
      v10 = Min_CubeGetVar((Min_Cube_t *)ppPrev,Index);
      v11 = Min_CubeGetVar((Min_Cube_t *)ppPrev,fCont0);
      Var0 = Min_CubeGetVar((Min_Cube_t *)ppPrevT,Index);
      uVar4 = Min_CubeGetVar((Min_Cube_t *)ppPrevT,fCont0);
      ppMVar2 = ppPrev;
      iVar5 = v10;
      iVar3 = Index;
      Var1 = uVar4;
      if ((v10 == Var0) || (v11 == uVar4)) {
        __assert_fail("v00 != v10 && v01 != v11",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                      ,0xa3,"void Min_SopRewrite(Min_Man_t *)");
      }
      if ((v10 == 3) && (v11 == 3)) {
        __assert_fail("v00 != 3 || v01 != 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                      ,0xa4,"void Min_SopRewrite(Min_Man_t *)");
      }
      if ((Var0 == 3) && (uVar4 == 3)) {
        __assert_fail("v10 != 3 || v11 != 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                      ,0xa5,"void Min_SopRewrite(Min_Man_t *)");
      }
      if ((((v10 == 3) || (v11 == 3)) || (Var0 == 3)) || (uVar4 == 3)) {
        if ((v10 != 3) && (v11 != 3)) {
          if ((Var0 != 3) && (uVar4 != 3)) {
            __assert_fail("v10 == 3 || v11 == 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                          ,0xee,"void Min_SopRewrite(Min_Man_t *)");
          }
          _v01 = ppPrev;
          ppPrev = ppPrevT;
          ppPrevT = ppMVar2;
          v10 = Var0;
          Var0 = iVar5;
          Var1 = v11;
          v11 = uVar4;
        }
        iVar1 = v10;
        iVar5 = Var0;
        if (v10 != 3) {
          if (v11 != 3) {
            __assert_fail("v01 == 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                          ,0xf7,"void Min_SopRewrite(Min_Man_t *)");
          }
          Index = fCont0;
          fCont0 = iVar3;
          v10 = v11;
          v11 = iVar1;
          Var0 = Var1;
          Var1 = iVar5;
        }
        if ((v10 == 3) && (Var1 == 3)) {
          if ((v11 == 3) || (Var0 == 3)) {
            __assert_fail("v01 != 3 && v10 != 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                          ,0x100,"void Min_SopRewrite(Min_Man_t *)");
          }
          Min_CubeXorVar((Min_Cube_t *)ppPrev,Index,Var0);
          Min_CubeXorVar((Min_Cube_t *)ppPrev,fCont0,3);
          *(uint *)(ppPrev + 1) =
               *(uint *)(ppPrev + 1) & 0x3fffff | ((*(uint *)(ppPrev + 1) >> 0x16) + 1) * 0x400000;
          iVar3 = Min_CoverContainsCube((Min_Man_t *)pCube,(Min_Cube_t *)ppPrev);
          Min_CubeXorVar((Min_Cube_t *)ppPrev,Index,Var0);
          Min_CubeXorVar((Min_Cube_t *)ppPrev,fCont0,3);
          *(uint *)(ppPrev + 1) =
               *(uint *)(ppPrev + 1) & 0x3fffff | ((*(uint *)(ppPrev + 1) >> 0x16) - 1) * 0x400000;
          if (iVar3 == 0) {
            Min_CubeXorVar((Min_Cube_t *)ppPrev,Index,Var0);
            *(uint *)(ppPrev + 1) =
                 *(uint *)(ppPrev + 1) & 0x3fffff | ((*(uint *)(ppPrev + 1) >> 0x16) + 1) * 0x400000
            ;
            iVar3 = *(int *)&pCube[5].pNext;
            Min_SopAddCube((Min_Man_t *)pCube,(Min_Cube_t *)ppPrev);
            if (*(int *)&pCube[5].pNext < iVar3 + 1) {
              Min_SopAddCube((Min_Man_t *)pCube,(Min_Cube_t *)ppPrevT);
            }
            else {
              if (ppPrev != *(Min_Cube_t ***)
                             (*(long *)&pCube[5].field_0x8 +
                             (ulong)(*(uint *)(ppPrev + 1) >> 0x16) * 8)) {
                __assert_fail("pCube == p->ppStore[pCube->nLits]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                              ,0x125,"void Min_SopRewrite(Min_Man_t *)");
              }
              *(Min_Cube_t **)
               (*(long *)&pCube[5].field_0x8 + (ulong)(*(uint *)(ppPrev + 1) >> 0x16) * 8) = *ppPrev
              ;
              *(int *)&pCube[5].pNext = *(int *)&pCube[5].pNext + -1;
              Min_CubeXorVar((Min_Cube_t *)ppPrev,Index,Var0);
              *(uint *)(ppPrev + 1) =
                   *(uint *)(ppPrev + 1) & 0x3fffff |
                   ((*(uint *)(ppPrev + 1) >> 0x16) - 1) * 0x400000;
              Min_CubeXorVar((Min_Cube_t *)ppPrevT,fCont0,v11);
              *(uint *)(ppPrevT + 1) =
                   *(uint *)(ppPrevT + 1) & 0x3fffff |
                   ((*(uint *)(ppPrevT + 1) >> 0x16) + 1) * 0x400000;
              Min_SopAddCube((Min_Man_t *)pCube,(Min_Cube_t *)ppPrev);
              Min_SopAddCube((Min_Man_t *)pCube,(Min_Cube_t *)ppPrevT);
            }
          }
          else {
            Min_CubeRecycle((Min_Man_t *)pCube,(Min_Cube_t *)ppPrevT);
            Min_CubeXorVar((Min_Cube_t *)ppPrev,fCont0,v11 ^ 3);
            *(uint *)(ppPrev + 1) =
                 *(uint *)(ppPrev + 1) & 0x3fffff | ((*(uint *)(ppPrev + 1) >> 0x16) - 1) * 0x400000
            ;
            Min_SopAddCube((Min_Man_t *)pCube,(Min_Cube_t *)ppPrev);
          }
        }
        else {
          if ((v11 == 3) || ((Var0 == 3 || (Var1 == 3)))) {
            __assert_fail("v01 != 3 && v10 != 3 && v11 != 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                          ,0x139,"void Min_SopRewrite(Min_Man_t *)");
          }
          Min_CubeXorVar((Min_Cube_t *)ppPrevT,Index,3);
          iVar3 = Min_CoverContainsCube((Min_Man_t *)pCube,(Min_Cube_t *)ppPrevT);
          Min_CubeXorVar((Min_Cube_t *)ppPrevT,Index,3);
          if (iVar3 == 0) {
            Min_CubeXorVar((Min_Cube_t *)ppPrev,Index,Var0);
            *(uint *)(ppPrev + 1) =
                 *(uint *)(ppPrev + 1) & 0x3fffff | ((*(uint *)(ppPrev + 1) >> 0x16) + 1) * 0x400000
            ;
            Min_CubeXorVar((Min_Cube_t *)ppPrevT,fCont0,Var1 ^ 3);
            *(uint *)(ppPrevT + 1) =
                 *(uint *)(ppPrevT + 1) & 0x3fffff |
                 ((*(uint *)(ppPrevT + 1) >> 0x16) - 1) * 0x400000;
            Min_SopAddCube((Min_Man_t *)pCube,(Min_Cube_t *)ppPrev);
            Min_SopAddCube((Min_Man_t *)pCube,(Min_Cube_t *)ppPrevT);
          }
          else {
            Min_CubeRecycle((Min_Man_t *)pCube,(Min_Cube_t *)ppPrevT);
            Min_CubeXorVar((Min_Cube_t *)ppPrev,fCont0,v11 ^ 3);
            *(uint *)(ppPrev + 1) =
                 *(uint *)(ppPrev + 1) & 0x3fffff | ((*(uint *)(ppPrev + 1) >> 0x16) - 1) * 0x400000
            ;
            Min_SopAddCube((Min_Man_t *)pCube,(Min_Cube_t *)ppPrev);
          }
        }
      }
      else {
        if (v10 != (Var0 ^ 3U)) {
          __assert_fail("v00 == (v10 ^ 3)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                        ,0xb2,"void Min_SopRewrite(Min_Man_t *)");
        }
        if (v11 != (uVar4 ^ 3)) {
          __assert_fail("v01 == (v11 ^ 3)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covMinSop.c"
                        ,0xb3,"void Min_SopRewrite(Min_Man_t *)");
        }
        Min_CubeXorVar((Min_Cube_t *)ppPrev,Index,3);
        iVar3 = Min_CoverContainsCube((Min_Man_t *)pCube,(Min_Cube_t *)ppPrev);
        Min_CubeXorVar((Min_Cube_t *)ppPrev,Index,3);
        Min_CubeXorVar((Min_Cube_t *)ppPrev,fCont0,3);
        iVar5 = Min_CoverContainsCube((Min_Man_t *)pCube,(Min_Cube_t *)ppPrev);
        Min_CubeXorVar((Min_Cube_t *)ppPrev,fCont0,3);
        if ((iVar3 == 0) || (iVar5 == 0)) {
          if (iVar3 == 0) {
            if (iVar5 == 0) {
              Min_SopAddCube((Min_Man_t *)pCube,(Min_Cube_t *)ppPrev);
              Min_SopAddCube((Min_Man_t *)pCube,(Min_Cube_t *)ppPrevT);
            }
            else {
              Min_CubeXorVar((Min_Cube_t *)ppPrev,fCont0,v11 ^ 3);
              *(uint *)(ppPrev + 1) =
                   *(uint *)(ppPrev + 1) & 0x3fffff |
                   ((*(uint *)(ppPrev + 1) >> 0x16) - 1) * 0x400000;
              Min_SopAddCube((Min_Man_t *)pCube,(Min_Cube_t *)ppPrev);
              Min_CubeXorVar((Min_Cube_t *)ppPrevT,Index,Var0 ^ 3);
              *(uint *)(ppPrevT + 1) =
                   *(uint *)(ppPrevT + 1) & 0x3fffff |
                   ((*(uint *)(ppPrevT + 1) >> 0x16) - 1) * 0x400000;
              Min_SopAddCube((Min_Man_t *)pCube,(Min_Cube_t *)ppPrevT);
            }
          }
          else {
            Min_CubeXorVar((Min_Cube_t *)ppPrev,Index,v10 ^ 3);
            *(uint *)(ppPrev + 1) =
                 *(uint *)(ppPrev + 1) & 0x3fffff | ((*(uint *)(ppPrev + 1) >> 0x16) - 1) * 0x400000
            ;
            Min_SopAddCube((Min_Man_t *)pCube,(Min_Cube_t *)ppPrev);
            Min_CubeXorVar((Min_Cube_t *)ppPrevT,fCont0,Var1 ^ 3);
            *(uint *)(ppPrevT + 1) =
                 *(uint *)(ppPrevT + 1) & 0x3fffff |
                 ((*(uint *)(ppPrevT + 1) >> 0x16) - 1) * 0x400000;
            Min_SopAddCube((Min_Man_t *)pCube,(Min_Cube_t *)ppPrevT);
          }
        }
        else {
          Min_CubeRecycle((Min_Man_t *)pCube,(Min_Cube_t *)ppPrevT);
          Min_CubeXorVar((Min_Cube_t *)ppPrev,Index,v10 ^ 3);
          Min_CubeXorVar((Min_Cube_t *)ppPrev,fCont0,v11 ^ 3);
          *(uint *)(ppPrev + 1) =
               *(uint *)(ppPrev + 1) & 0x3fffff | ((*(uint *)(ppPrev + 1) >> 0x16) - 2) * 0x400000;
          Min_SopAddCube((Min_Man_t *)pCube,(Min_Cube_t *)ppPrev);
        }
      }
    }
  } while( true );
}

Assistant:

void Min_SopRewrite( Min_Man_t * p )
{
    Min_Cube_t * pCube, ** ppPrev;
    Min_Cube_t * pThis, ** ppPrevT;
    Min_Cube_t * pTemp;
    int v00, v01, v10, v11, Var0, Var1, Index, fCont0, fCont1, nCubesOld;
    int nPairs = 0;
/*    
    {
        Min_Cube_t * pCover;
        pCover = Min_CoverCollect( p, p->nVars );
printf( "\n\n" );
Min_CoverWrite( stdout, pCover );
        Min_CoverExpand( p, pCover );
    }
*/

    // insert the bubble before the first cube
    p->pBubble->pNext = p->ppStore[0];
    p->ppStore[0] = p->pBubble;
    p->pBubble->nLits = 0;

    // go through the cubes
    while ( 1 )
    {
        // get the index of the bubble
        Index = p->pBubble->nLits;

        // find the bubble
        Min_CoverForEachCubePrev( p->ppStore[Index], pCube, ppPrev )
            if ( pCube == p->pBubble )
                break;
        assert( pCube == p->pBubble );

        // remove the bubble, get the next cube after the bubble
        *ppPrev = p->pBubble->pNext;
        pCube = p->pBubble->pNext;
        if ( pCube == NULL )
            for ( Index++; Index <= p->nVars; Index++ )
                if ( p->ppStore[Index] )
                {
                    ppPrev = &(p->ppStore[Index]);
                    pCube = p->ppStore[Index];
                    break;
                }
        // stop if there is no more cubes
        if ( pCube == NULL )
            break;

        // find the first dist2 cube
        Min_CoverForEachCubePrev( pCube->pNext, pThis, ppPrevT )
            if ( Min_CubesDistTwo( pCube, pThis, &Var0, &Var1 ) )
                break;
        if ( pThis == NULL && Index < p->nVars )
        Min_CoverForEachCubePrev( p->ppStore[Index+1], pThis, ppPrevT )
            if ( Min_CubesDistTwo( pCube, pThis, &Var0, &Var1 ) )
                break;
        // continue if there is no dist2 cube
        if ( pThis == NULL )
        {
            // insert the bubble after the cube
            p->pBubble->pNext = pCube->pNext;
            pCube->pNext = p->pBubble;
            p->pBubble->nLits = pCube->nLits;
            continue;
        }
        nPairs++;
/*
printf( "\n" );
Min_CubeWrite( stdout, pCube );
Min_CubeWrite( stdout, pThis );
*/
        // remove the cubes, insert the bubble instead of pCube
        *ppPrevT = pThis->pNext;
        *ppPrev = p->pBubble;
        p->pBubble->pNext = pCube->pNext;
        p->pBubble->nLits = pCube->nLits;
        p->nCubes -= 2;

        assert( pCube != p->pBubble && pThis != p->pBubble );


        // save the dist2 parameters
        v00 = Min_CubeGetVar( pCube, Var0 );
        v01 = Min_CubeGetVar( pCube, Var1 );
        v10 = Min_CubeGetVar( pThis, Var0 );
        v11 = Min_CubeGetVar( pThis, Var1 );
        assert( v00 != v10 && v01 != v11 );
        assert( v00 != 3   || v01 != 3 );
        assert( v10 != 3   || v11 != 3 );

//printf( "\n" );
//Min_CubeWrite( stdout, pCube );
//Min_CubeWrite( stdout, pThis );

//printf( "\n" );
//Min_CubeWrite( stdout, pCube );
//Min_CubeWrite( stdout, pThis );

        // consider the case when both cubes have non-empty literals
        if ( v00 != 3 && v01 != 3 && v10 != 3 && v11 != 3 )
        {
            assert( v00 == (v10 ^ 3) );
            assert( v01 == (v11 ^ 3) );
            // create the temporary cube equal to the first corner
            Min_CubeXorVar( pCube, Var0, 3 );
            // check if this cube is contained
            fCont0 = Min_CoverContainsCube( p, pCube );
            // create the temporary cube equal to the first corner
            Min_CubeXorVar( pCube, Var0, 3 );
            Min_CubeXorVar( pCube, Var1, 3 );
//printf( "\n" );
//Min_CubeWrite( stdout, pCube );
//Min_CubeWrite( stdout, pThis );
            // check if this cube is contained
            fCont1 = Min_CoverContainsCube( p, pCube );
            // undo the change
            Min_CubeXorVar( pCube, Var1, 3 );

            // check if the cubes can be overwritten
            if ( fCont0 && fCont1 )
            {
                // one of the cubes can be recycled, the other expanded and added
                Min_CubeRecycle( p, pThis );
                // remove the literals
                Min_CubeXorVar( pCube, Var0, v00 ^ 3 );
                Min_CubeXorVar( pCube, Var1, v01 ^ 3 );
                pCube->nLits -= 2;
                Min_SopAddCube( p, pCube );
            }
            else if ( fCont0 )
            {
                // expand both cubes and add them
                Min_CubeXorVar( pCube, Var0, v00 ^ 3 );
                pCube->nLits--;
                Min_SopAddCube( p, pCube );
                Min_CubeXorVar( pThis, Var1, v11 ^ 3 );
                pThis->nLits--;
                Min_SopAddCube( p, pThis );
            }
            else if ( fCont1 )
            {
                // expand both cubes and add them
                Min_CubeXorVar( pCube, Var1, v01 ^ 3 );
                pCube->nLits--;
                Min_SopAddCube( p, pCube );
                Min_CubeXorVar( pThis, Var0, v10 ^ 3 );
                pThis->nLits--;
                Min_SopAddCube( p, pThis );
            }
            else
            {
                Min_SopAddCube( p, pCube );
                Min_SopAddCube( p, pThis );
            }
            // otherwise, no change is possible
            continue;
        }

        // if one of them does not have DC lit, move it
        if ( v00 != 3 && v01 != 3 )
        {
            assert( v10 == 3 || v11 == 3 );
            pTemp = pCube; pCube = pThis; pThis = pTemp;
            Index = v00; v00 = v10; v10 = Index;
            Index = v01; v01 = v11; v11 = Index;
        }

        // make sure the first cube has first var DC
        if ( v00 != 3 )
        {
            assert( v01 == 3 );
            Index = Var0; Var0 = Var1; Var1 = Index;
            Index = v00; v00 = v01; v01 = Index;
            Index = v10; v10 = v11; v11 = Index;
        }

        // consider both cases: both have DC lit
        if ( v00 == 3 && v11 == 3 )
        {
            assert( v01 != 3 && v10 != 3 );
            // try the remaining minterm
            // create the temporary cube equal to the first corner
            Min_CubeXorVar( pCube, Var0, v10 );
            Min_CubeXorVar( pCube, Var1, 3   );
            pCube->nLits++;
            // check if this cube is contained
            fCont0 = Min_CoverContainsCube( p, pCube );
            // undo the cube transformations
            Min_CubeXorVar( pCube, Var0, v10 );
            Min_CubeXorVar( pCube, Var1, 3   );
            pCube->nLits--;
            // check the case when both are covered
            if ( fCont0 )
            {
                // one of the cubes can be recycled, the other expanded and added
                Min_CubeRecycle( p, pThis );
                // remove the literals
                Min_CubeXorVar( pCube, Var1, v01 ^ 3 );
                pCube->nLits--;
                Min_SopAddCube( p, pCube );
            }
            else
            {
                // try two reduced cubes
                Min_CubeXorVar( pCube, Var0, v10 );
                pCube->nLits++;
                // remember the cubes
                nCubesOld = p->nCubes;
                Min_SopAddCube( p, pCube );
                // check if the cube is absorbed
                if ( p->nCubes < nCubesOld + 1 )
                { // absorbed - add the second cube
                    Min_SopAddCube( p, pThis );
                }
                else
                { // remove this cube, and try another one
                    assert( pCube == p->ppStore[pCube->nLits] );
                    p->ppStore[pCube->nLits] = pCube->pNext;
                    p->nCubes--;

                    // return the cube to the previous state
                    Min_CubeXorVar( pCube, Var0, v10 );
                    pCube->nLits--;

                    // generate another reduced cube
                    Min_CubeXorVar( pThis, Var1, v01 );
                    pThis->nLits++;

                    // add both cubes
                    Min_SopAddCube( p, pCube );
                    Min_SopAddCube( p, pThis );
                }
            }
        }
        else // the first cube has DC lit
        {
            assert( v01 != 3 && v10 != 3 && v11 != 3 );
            // try the remaining minterm
            // create the temporary cube equal to the minterm
            Min_CubeXorVar( pThis, Var0, 3 );
            // check if this cube is contained
            fCont0 = Min_CoverContainsCube( p, pThis );
            // undo the cube transformations
            Min_CubeXorVar( pThis, Var0, 3 );
            // check the case when both are covered
            if ( fCont0 )
            {
                // one of the cubes can be recycled, the other expanded and added
                Min_CubeRecycle( p, pThis );
                // remove the literals
                Min_CubeXorVar( pCube, Var1, v01 ^ 3 );
                pCube->nLits--;
                Min_SopAddCube( p, pCube );
            }
            else
            {
                // try reshaping the cubes
                // reduce the first cube
                Min_CubeXorVar( pCube, Var0, v10 );
                pCube->nLits++;
                // expand the second cube
                Min_CubeXorVar( pThis, Var1, v11 ^ 3 );
                pThis->nLits--;
                // add both cubes
                Min_SopAddCube( p, pCube );
                Min_SopAddCube( p, pThis );
            }
        }
    }
//    printf( "Pairs = %d  ", nPairs );
}